

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_utility.hpp
# Opt level: O2

string * __thiscall
squall::get_type_text_abi_cxx11_(string *__return_storage_ptr__,squall *this,SQObjectType t)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 == 0x800) {
    pcVar3 = "userpointer";
    paVar1 = &local_13;
  }
  else if (iVar2 == 0xa008000) {
    pcVar3 = "instance";
    paVar1 = &local_15;
  }
  else if (iVar2 == 0x5000002) {
    pcVar3 = "integer";
    paVar1 = &local_a;
  }
  else if (iVar2 == 0x5000004) {
    pcVar3 = "float";
    paVar1 = &local_b;
  }
  else if (iVar2 == 0x8000010) {
    pcVar3 = "string";
    paVar1 = &local_c;
  }
  else if (iVar2 == 0x8000040) {
    pcVar3 = "array";
    paVar1 = &local_e;
  }
  else if (iVar2 == 0x8000100) {
    pcVar3 = "closurefunction";
    paVar1 = &local_10;
  }
  else if (iVar2 == 0x8000200) {
    pcVar3 = "native closureC function";
    paVar1 = &local_11;
  }
  else if (iVar2 == 0x8000400) {
    pcVar3 = "generator";
    paVar1 = &local_12;
  }
  else if (iVar2 == 0x8004000) {
    pcVar3 = "class";
    paVar1 = &local_14;
  }
  else if (iVar2 == 0x8010000) {
    pcVar3 = "weak reference";
    paVar1 = &local_16;
  }
  else if (iVar2 == 0xa000020) {
    pcVar3 = "table";
    paVar1 = &local_d;
  }
  else if (iVar2 == 0xa000080) {
    pcVar3 = "userdata";
    paVar1 = &local_f;
  }
  else if (iVar2 == 0x1000001) {
    pcVar3 = "null";
    paVar1 = &local_9;
  }
  else {
    pcVar3 = "unknown";
    paVar1 = &local_17;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

inline
string get_type_text(SQObjectType t) {
    switch(t) {
        case OT_NULL:           return _SC("null");
        case OT_INTEGER:        return _SC("integer");
        case OT_FLOAT:          return _SC("float");
        case OT_STRING:         return _SC("string");
        case OT_TABLE:          return _SC("table");
        case OT_ARRAY:          return _SC("array");
        case OT_USERDATA:       return _SC("userdata");
        case OT_CLOSURE:        return _SC("closurefunction");
        case OT_NATIVECLOSURE:  return _SC("native closureC function");
        case OT_GENERATOR:      return _SC("generator");
        case OT_USERPOINTER:    return _SC("userpointer");
        case OT_CLASS:          return _SC("class");
        case OT_INSTANCE:       return _SC("instance");
        case OT_WEAKREF:        return _SC("weak reference");
        default:                return _SC("unknown");
    }
}